

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_comp.cpp
# Opt level: O0

bool __thiscall
crnlib::crn_comp::pack_color_endpoints_etc
          (crn_comp *this,vector<unsigned_char> *packed_data,vector<unsigned_short> *remapping)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint *puVar4;
  unsigned_short *puVar5;
  vector<unsigned_char> *other;
  uint local_154;
  uint local_150;
  uint32 c_1;
  uint32 e_1;
  uint32 _e_1;
  uint32 p_1;
  uint32 prev_endpoint_1;
  symbol_codec codec;
  static_huffman_data_model dm;
  uint local_68;
  uint32 c;
  uint32 e;
  uint32 _e;
  uint32 p;
  uint32 prev_endpoint;
  symbol_histogram hist;
  uint local_34;
  undefined1 local_30 [4];
  uint i;
  vector<unsigned_int> remapped_endpoints;
  vector<unsigned_short> *remapping_local;
  vector<unsigned_char> *packed_data_local;
  crn_comp *this_local;
  
  remapped_endpoints._8_8_ = remapping;
  uVar3 = vector<unsigned_int>::size(&this->m_color_endpoints);
  vector<unsigned_int>::vector((vector<unsigned_int> *)local_30,uVar3);
  local_34 = 0;
  while( true ) {
    uVar3 = vector<unsigned_int>::size(&this->m_color_endpoints);
    if (uVar3 <= local_34) break;
    puVar4 = vector<unsigned_int>::operator[](&this->m_color_endpoints,local_34);
    uVar1 = *puVar4;
    puVar4 = vector<unsigned_int>::operator[](&this->m_color_endpoints,local_34);
    uVar2 = *puVar4;
    puVar5 = vector<unsigned_short>::operator[]
                       ((vector<unsigned_short> *)remapped_endpoints._8_8_,local_34);
    puVar4 = vector<unsigned_int>::operator[]((vector<unsigned_int> *)local_30,(uint)*puVar5);
    *puVar4 = uVar1 & 0x7000000 | uVar2 >> 3 & 0x1f1f1f;
    local_34 = local_34 + 1;
  }
  symbol_histogram::symbol_histogram((symbol_histogram *)&p,0x20);
  _e = 0;
  e = 0;
  while( true ) {
    uVar3 = vector<unsigned_int>::size((vector<unsigned_int> *)local_30);
    if (uVar3 <= e) break;
    c = _e;
    puVar4 = vector<unsigned_int>::operator[]((vector<unsigned_int> *)local_30,e);
    _e = *puVar4;
    local_68 = _e;
    for (dm._52_4_ = 0; (uint)dm._52_4_ < 4; dm._52_4_ = dm._52_4_ + 1) {
      symbol_histogram::inc_freq((symbol_histogram *)&p,local_68 - c & 0x1f,1);
      c = c >> 8;
      local_68 = local_68 >> 8;
    }
    e = e + 1;
  }
  static_huffman_data_model::static_huffman_data_model
            ((static_huffman_data_model *)&codec.m_support_arith);
  static_huffman_data_model::init
            ((static_huffman_data_model *)&codec.m_support_arith,(EVP_PKEY_CTX *)0x1);
  symbol_codec::symbol_codec((symbol_codec *)&p_1);
  symbol_codec::start_encoding((symbol_codec *)&p_1,0x100000);
  symbol_codec::encode_transmit_static_huffman_data_model
            ((symbol_codec *)&p_1,(static_huffman_data_model *)&codec.m_support_arith,false,
             (static_huffman_data_model *)0x0);
  _e_1 = 0;
  e_1 = 0;
  while( true ) {
    uVar3 = vector<unsigned_int>::size((vector<unsigned_int> *)local_30);
    if (uVar3 <= e_1) break;
    c_1 = _e_1;
    puVar4 = vector<unsigned_int>::operator[]((vector<unsigned_int> *)local_30,e_1);
    _e_1 = *puVar4;
    local_150 = _e_1;
    for (local_154 = 0; local_154 < 4; local_154 = local_154 + 1) {
      symbol_codec::encode
                ((symbol_codec *)&p_1,local_150 - c_1 & 0x1f,
                 (static_huffman_data_model *)&codec.m_support_arith);
      c_1 = c_1 >> 8;
      local_150 = local_150 >> 8;
    }
    e_1 = e_1 + 1;
  }
  symbol_codec::stop_encoding((symbol_codec *)&p_1,false);
  other = symbol_codec::get_encoding_buf((symbol_codec *)&p_1);
  vector<unsigned_char>::swap(packed_data,other);
  symbol_codec::~symbol_codec((symbol_codec *)&p_1);
  static_huffman_data_model::~static_huffman_data_model
            ((static_huffman_data_model *)&codec.m_support_arith);
  symbol_histogram::~symbol_histogram((symbol_histogram *)&p);
  vector<unsigned_int>::~vector((vector<unsigned_int> *)local_30);
  return true;
}

Assistant:

bool crn_comp::pack_color_endpoints_etc(crnlib::vector<uint8>& packed_data, const crnlib::vector<uint16>& remapping)
    {
        crnlib::vector<uint32> remapped_endpoints(m_color_endpoints.size());
        for (uint i = 0; i < m_color_endpoints.size(); i++)
        {
            remapped_endpoints[remapping[i]] = (m_color_endpoints[i] & 0x07000000) | (m_color_endpoints[i] >> 3 & 0x001F1F1F);
        }

        symbol_histogram hist(32);
        for (uint32 prev_endpoint = 0, p = 0; p < remapped_endpoints.size(); p++)
        {
            for (uint32 _e = prev_endpoint, e = prev_endpoint = remapped_endpoints[p], c = 0; c < 4; c++, _e >>= 8, e >>= 8)
            {
                hist.inc_freq((e - _e) & 0x1F);
            }
        }
        static_huffman_data_model dm;
        dm.init(true, hist, 15);
        symbol_codec codec;
        codec.start_encoding(1024 * 1024);
        codec.encode_transmit_static_huffman_data_model(dm, false);
        for (uint32 prev_endpoint = 0, p = 0; p < remapped_endpoints.size(); p++)
        {
            for (uint32 _e = prev_endpoint, e = prev_endpoint = remapped_endpoints[p], c = 0; c < 4; c++, _e >>= 8, e >>= 8)
            {
                codec.encode((e - _e) & 0x1F, dm);
            }
        }
        codec.stop_encoding(false);
        packed_data.swap(codec.get_encoding_buf());
        return true;
    }